

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O2

void __thiscall
cppnet::BaseLogger::Fatal
          (BaseLogger *this,char *file,uint32_t line,char *content,__va_list_tag *list)

{
  element_type *peVar1;
  uint32_t uVar2;
  shared_ptr<cppnet::Log> log;
  undefined8 *local_40;
  
  if ((this->_level & 1) != 0) {
    GetLog((BaseLogger *)&stack0xffffffffffffffc0);
    uVar2 = FormatLog(file,line,"FAT",content,list,(char *)*local_40,*(uint32_t *)(local_40 + 1));
    *(uint32_t *)(local_40 + 1) = uVar2;
    peVar1 = (this->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      (**(code **)(*(long *)peVar1 + 0x30))(peVar1,&stack0xffffffffffffffc0);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void BaseLogger::Fatal(const char* file, uint32_t line, const char* content, va_list list) {
    if (!(_level & LLM_FATAL)) {
        return;
    }

    std::shared_ptr<Log> log = GetLog();
    log->_len = FormatLog(file, line, "FAT", content, list, log->_log, log->_len);

    if (_logger) {
        _logger->Fatal(log);
    }
}